

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O0

REF_STATUS ref_smooth_tri_uv_area_around(REF_GRID ref_grid,REF_INT node,REF_DBL *min_uv_area)

{
  REF_CELL ref_cell_00;
  uint uVar1;
  bool bVar2;
  REF_INT local_e4;
  REF_DBL local_e0;
  REF_INT local_d4;
  int local_d0;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL uv_area;
  REF_DBL sign_uv_area;
  REF_INT local_a8;
  REF_BOOL none_found;
  REF_INT nodes [27];
  REF_INT cell;
  REF_INT item;
  REF_INT id;
  REF_CELL ref_cell;
  REF_DBL *min_uv_area_local;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  ref_cell_00 = ref_grid->cell[3];
  sign_uv_area._4_4_ = 1;
  *min_uv_area = -2.0;
  if ((node < 0) || (ref_cell_00->ref_adj->nnode <= node)) {
    local_d0 = -1;
  }
  else {
    local_d0 = ref_cell_00->ref_adj->first[node];
  }
  nodes[0x1a] = local_d0;
  if (local_d0 == -1) {
    local_d4 = -1;
  }
  else {
    local_d4 = ref_cell_00->ref_adj->item[local_d0].ref;
  }
  nodes[0x19] = local_d4;
  while( true ) {
    if (nodes[0x1a] == -1) {
      bVar2 = sign_uv_area._4_4_ != 0;
      if (bVar2) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0xf2,"ref_smooth_tri_uv_area_around","no triangle found, can not compute min uv area"
              );
      }
      ref_grid_local._4_4_ = (uint)bVar2;
      return ref_grid_local._4_4_;
    }
    uVar1 = ref_cell_nodes(ref_cell_00,nodes[0x19],&local_a8);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0xe5
             ,"ref_smooth_tri_uv_area_around",(ulong)uVar1,"nodes");
      return uVar1;
    }
    uVar1 = ref_geom_uv_area_sign(ref_grid,(&local_a8)[ref_cell_00->node_per],&uv_area);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0xe7
             ,"ref_smooth_tri_uv_area_around",(ulong)uVar1,"sign");
      return uVar1;
    }
    uVar1 = ref_geom_uv_area(ref_grid->geom,&local_a8,(REF_DBL *)&ref_private_macro_code_rss_1);
    if (uVar1 != 0) break;
    _ref_private_macro_code_rss_1 = uv_area * _ref_private_macro_code_rss_1;
    if (sign_uv_area._4_4_ == 0) {
      local_e0 = _ref_private_macro_code_rss_1;
      if (*min_uv_area < _ref_private_macro_code_rss_1) {
        local_e0 = *min_uv_area;
      }
      *min_uv_area = local_e0;
    }
    else {
      *min_uv_area = _ref_private_macro_code_rss_1;
      sign_uv_area._4_4_ = 0;
    }
    nodes[0x1a] = ref_cell_00->ref_adj->item[nodes[0x1a]].next;
    if (nodes[0x1a] == -1) {
      local_e4 = -1;
    }
    else {
      local_e4 = ref_cell_00->ref_adj->item[nodes[0x1a]].ref;
    }
    nodes[0x19] = local_e4;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0xe8,
         "ref_smooth_tri_uv_area_around",(ulong)uVar1,"uv area");
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_tri_uv_area_around(REF_GRID ref_grid,
                                                        REF_INT node,
                                                        REF_DBL *min_uv_area) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT id, item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL none_found = REF_TRUE;
  REF_DBL sign_uv_area, uv_area;

  *min_uv_area = -2.0;

  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    id = nodes[ref_cell_node_per(ref_cell)];
    RSS(ref_geom_uv_area_sign(ref_grid, id, &sign_uv_area), "sign");
    RSS(ref_geom_uv_area(ref_grid_geom(ref_grid), nodes, &uv_area), "uv area");
    uv_area *= sign_uv_area;
    if (none_found) {
      *min_uv_area = uv_area;
      none_found = REF_FALSE;
    } else {
      *min_uv_area = MIN(*min_uv_area, uv_area);
    }
  }

  if (none_found) THROW("no triangle found, can not compute min uv area");

  return REF_SUCCESS;
}